

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::piece_picker::abort_download(piece_picker *this,piece_block block,torrent_peer *peer)

{
  piece_pos *this_00;
  ushort uVar1;
  pointer ppVar2;
  download_queue_t queue;
  int priority;
  int iVar3;
  iterator i;
  uint uVar4;
  long lVar5;
  pointer pbVar6;
  piece_index_t index;
  
  ppVar2 = (this->m_piece_map).
           super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  index = block.piece_index.m_val;
  uVar4 = *(uint *)(ppVar2 + index.m_val);
  queue.m_val = (byte)(uVar4 >> 0x1a) & 7;
  if (queue.m_val == 5) {
    queue.m_val = '\0';
  }
  else if ((uVar4 >> 0x1a & 7) == 6) {
    queue.m_val = '\x01';
  }
  if (queue.m_val != '\x04') {
    i = find_dl_piece(this,queue,index);
    lVar5 = (ulong)this->m_blocks_per_piece * (ulong)(i._M_current)->info_idx;
    pbVar6 = (this->m_block_info).
             super_vector<libtorrent::piece_picker::block_info,_std::allocator<libtorrent::piece_picker::block_info>_>
             .
             super__Vector_base<libtorrent::piece_picker::block_info,_std::allocator<libtorrent::piece_picker::block_info>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((*(ushort *)&pbVar6[lVar5 + ((long)block >> 0x20)].field_0x8 & 0xc000) == 0x4000) {
      this_00 = ppVar2 + index.m_val;
      pbVar6 = pbVar6 + lVar5 + ((long)block >> 0x20);
      priority = piece_pos::priority(this_00,this);
      uVar1 = *(ushort *)&pbVar6->field_0x8;
      if ((uVar1 & 0x3fff) != 0) {
        *(ushort *)&pbVar6->field_0x8 = uVar1 & 0xc000 | uVar1 - 1 & 0x3fff;
      }
      if (pbVar6->peer == peer) {
        pbVar6->peer = (torrent_peer *)0x0;
      }
      if ((*(ushort *)&pbVar6->field_0x8 & 0x3fff) == 0) {
        pbVar6->peer = (torrent_peer *)0x0;
        *(undefined2 *)&pbVar6->field_0x8 = 0;
        uVar4 = *(ushort *)&(i._M_current)->field_0xa - 1 & 0x7fff;
        *(ushort *)&(i._M_current)->field_0xa =
             *(ushort *)&(i._M_current)->field_0xa & 0x8000 | (ushort)uVar4;
        if ((*(uint *)&(i._M_current)->field_0x6 >> 0x10 & 0x7fff) != 0 ||
            (*(uint *)&(i._M_current)->field_0x6 & 0x7fff) + uVar4 != 0) {
          update_piece_state(this,i);
          return;
        }
        erase_download_piece(this,i);
        iVar3 = piece_pos::priority(this_00,this);
        if (this->m_dirty == false) {
          if ((priority == -1) && (-1 < iVar3)) {
            add(this,index);
            return;
          }
          if (-1 < priority) {
            update(this,priority,(prio_index_t)(this_00->index).m_val);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void piece_picker::abort_download(piece_block const block, torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "abort_download( {" << block.piece_index << ", " << block.block_index << "} )" << std::endl;
#endif
		TORRENT_ASSERT(peer == nullptr || peer->in_use);

		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);

		auto const state = m_piece_map[block.piece_index].download_queue();
		if (state == piece_pos::piece_open) return;

		auto i = find_dl_piece(state, block.piece_index);
		TORRENT_ASSERT(i != m_downloads[state].end());

		auto const binfo = mutable_blocks_for_piece(*i);
		block_info& info = binfo[block.block_index];
		TORRENT_ASSERT(info.peer == nullptr || info.peer->in_use);
		TORRENT_ASSERT(info.piece_index == block.piece_index);

		TORRENT_ASSERT(info.state != block_info::state_none);

		if (info.state != block_info::state_requested) return;

		piece_pos const& p = m_piece_map[block.piece_index];
		int const prev_prio = p.priority(this);

#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(info.peers.count(peer));
		info.peers.erase(peer);
#endif
		TORRENT_ASSERT(info.num_peers > 0);
		if (info.num_peers > 0) --info.num_peers;
		if (info.peer == peer) info.peer = nullptr;
		TORRENT_ASSERT(info.peers.size() == info.num_peers);

		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));

		// if there are other peers, leave the block requested
		if (info.num_peers > 0) return;

		// clear the downloader of this block
		info.peer = nullptr;

		// clear this block as being downloaded
		info.state = block_info::state_none;
		TORRENT_ASSERT(i->requested > 0);
		--i->requested;

		// if there are no other blocks in this piece
		// that's being downloaded, remove it from the list
		if (i->requested + i->finished + i->writing == 0)
		{
			TORRENT_ASSERT(prev_prio < int(m_priority_boundaries.size())
				|| m_dirty);
			erase_download_piece(i);
			int const prio = p.priority(this);
			if (!m_dirty)
			{
				if (prev_prio == -1 && prio >= 0) add(block.piece_index);
				else if (prev_prio >= 0) update(prev_prio, p.index);
			}
			return;
		}

		i = update_piece_state(i);
	}